

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *printer)

{
  size_t printer_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  pointer pMVar6;
  reference pvVar7;
  Options *pOVar8;
  Options *options;
  ulong uVar9;
  size_type sVar10;
  reference ppFVar11;
  mapped_type *pmVar12;
  string *__lhs;
  Descriptor *descriptor_00;
  pair<unsigned_long,_unsigned_long> pVar13;
  allocator local_551;
  string local_550;
  string local_530;
  byte local_50b;
  byte local_50a;
  allocator local_509;
  key_type local_508;
  byte local_4e2;
  allocator local_4e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  size_type local_4c0;
  byte local_4b3;
  byte local_4b2;
  allocator local_4b1;
  key_type local_4b0;
  byte local_48a;
  allocator local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  unsigned_long local_468;
  char *local_460;
  undefined1 local_451;
  undefined1 local_450 [7];
  bool eager;
  cpp *local_430;
  FileDescriptor *dep_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range4_1;
  cpp *local_3d8;
  FileDescriptor *dep;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range4;
  undefined1 local_398 [4];
  int num_deps;
  CrossFileReferences refs;
  string local_2d0;
  string local_2b0;
  int local_28c;
  undefined1 local_288 [4];
  int i_4;
  string local_268;
  int local_248;
  int local_244;
  int j;
  int i_3;
  string file_data;
  FileDescriptorProto file_proto;
  string local_140;
  undefined1 local_120 [8];
  string protodef_name;
  string local_e0;
  cpp *local_c0;
  Descriptor *descriptor;
  int local_b0;
  int i_2;
  int i_1;
  int offset;
  unsigned_long local_a0;
  int local_94;
  undefined1 local_90 [4];
  int i;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairs;
  size_type local_70 [3];
  size_type local_58;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  bVar1 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::empty(&this->message_generators_);
  if (!bVar1) {
    local_58 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::size(&this->message_generators_);
    Formatter::operator()
              ((Formatter *)local_50,"static ::$proto_ns$::Metadata $file_level_metadata$[$1$];\n",
               &local_58);
  }
  bVar1 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          ::empty(&this->enum_generators_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "static constexpr ::$proto_ns$::EnumDescriptor const** $file_level_enum_descriptors$ = nullptr;\n"
              );
  }
  else {
    local_70[0] = std::
                  vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                  ::size(&this->enum_generators_);
    Formatter::operator()
              ((Formatter *)local_50,
               "static const ::$proto_ns$::EnumDescriptor* $file_level_enum_descriptors$[$1$];\n",
               local_70);
  }
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if ((bVar1) && (iVar2 = FileDescriptor::service_count(this->file_), 0 < iVar2)) {
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         FileDescriptor::service_count(this->file_);
    Formatter::operator()
              ((Formatter *)local_50,
               "static const ::$proto_ns$::ServiceDescriptor* $file_level_service_descriptors$[$1$];\n"
               ,(int *)((long)&pairs.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "static constexpr ::$proto_ns$::ServiceDescriptor const** $file_level_service_descriptors$ = nullptr;\n"
              );
  }
  bVar1 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::empty(&this->message_generators_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "const $uint32$ $tablename$::offsets[1] = {};\nstatic constexpr ::$proto_ns$::internal::MigrationSchema* schemas = nullptr;\nstatic constexpr ::$proto_ns$::Message* const* file_default_instances = nullptr;\n\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "\nconst $uint32$ $tablename$::offsets[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    Formatter::Indent((Formatter *)local_50);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)local_90);
    sVar3 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::size(&this->message_generators_);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_90,sVar3);
    local_94 = 0;
    while( true ) {
      uVar4 = (ulong)local_94;
      sVar3 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::size(&this->message_generators_);
      if (sVar3 <= uVar4) break;
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,(long)local_94);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      pVar13 = MessageGenerator::GenerateOffsets
                         (pMVar6,(Printer *)
                                 format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      _i_1 = pVar13;
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)local_90,(value_type *)&i_1);
      local_94 = local_94 + 1;
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "};\nstatic const ::$proto_ns$::internal::MigrationSchema schemas[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    Formatter::Indent((Formatter *)local_50);
    i_2 = 0;
    local_b0 = 0;
    while( true ) {
      uVar4 = (ulong)local_b0;
      sVar3 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::size(&this->message_generators_);
      if (sVar3 <= uVar4) break;
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,(long)local_b0);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      printer_00 = format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count;
      iVar2 = i_2;
      pvVar7 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             *)local_90,(long)local_b0);
      MessageGenerator::GenerateSchema(pMVar6,(Printer *)printer_00,iVar2,(int)pvVar7->second);
      pvVar7 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             *)local_90,(long)local_b0);
      i_2 = i_2 + (int)pvVar7->first;
      local_b0 = local_b0 + 1;
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "};\n\nstatic ::$proto_ns$::Message const * const file_default_instances[] = {\n");
    Formatter::Indent((Formatter *)local_50);
    descriptor._4_4_ = 0;
    while( true ) {
      pOVar8 = (Options *)(long)descriptor._4_4_;
      options = (Options *)
                std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ::size(&this->message_generators_);
      if (options <= pOVar8) break;
      pvVar5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::operator[](&this->message_generators_,(long)descriptor._4_4_);
      pMVar6 = std::
               unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator->(pvVar5);
      local_c0 = (cpp *)pMVar6->descriptor_;
      Namespace_abi_cxx11_(&local_e0,local_c0,(Descriptor *)&this->options_,options);
      ClassName_abi_cxx11_((string *)((long)&protodef_name.field_2 + 8),local_c0,descriptor_00);
      Formatter::operator()
                ((Formatter *)local_50,
                 "reinterpret_cast<const ::$proto_ns$::Message*>(&$1$::_$2$_default_instance_),\n",
                 &local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&protodef_name.field_2 + 8));
      std::__cxx11::string::~string((string *)(protodef_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_e0);
      descriptor._4_4_ = descriptor._4_4_ + 1;
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"};\n\n");
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_90);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"descriptor_table_protodef",
             (allocator *)((long)&file_proto.source_code_info_ + 7));
  UniqueName((string *)local_120,&local_140,this->file_,&this->options_);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&file_proto.source_code_info_ + 7));
  Formatter::operator()
            ((Formatter *)local_50,"const char $1$[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) =\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  Formatter::Indent((Formatter *)local_50);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8));
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)((long)&file_data.field_2 + 8));
  std::__cxx11::string::string((string *)&j);
  MessageLite::SerializeToString((MessageLite *)((long)&file_data.field_2 + 8),(string *)&j);
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 0x10000) {
    local_28c = 0;
    while( true ) {
      uVar4 = (ulong)local_28c;
      uVar9 = std::__cxx11::string::size();
      if (uVar9 <= uVar4) break;
      std::__cxx11::string::substr
                ((ulong)&refs.weak_reflection_files._M_h._M_single_bucket,(ulong)&j);
      CEscape(&local_2d0,(string *)&refs.weak_reflection_files._M_h._M_single_bucket);
      EscapeTrigraphs(&local_2b0,&local_2d0);
      Formatter::operator()((Formatter *)local_50,"\"$1$\"\n",&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&refs.weak_reflection_files._M_h._M_single_bucket);
      local_28c = local_28c + 0x28;
    }
  }
  else {
    Formatter::operator()<>((Formatter *)local_50,"{ ");
    local_244 = 0;
    while( true ) {
      uVar4 = (ulong)local_244;
      uVar9 = std::__cxx11::string::size();
      if (uVar9 <= uVar4) break;
      local_248 = 0;
      while( true ) {
        bVar1 = false;
        if (local_248 < 0x19) {
          uVar4 = (ulong)local_244;
          uVar9 = std::__cxx11::string::size();
          bVar1 = uVar4 < uVar9;
        }
        if (!bVar1) break;
        std::__cxx11::string::substr((ulong)local_288,(ulong)&j);
        CEscape(&local_268,(string *)local_288);
        Formatter::operator()((Formatter *)local_50,"\'$1$\', ",&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)local_288);
        local_244 = local_244 + 1;
        local_248 = local_248 + 1;
      }
      Formatter::operator()<>((Formatter *)local_50,"\n");
    }
    Formatter::operator()<>((Formatter *)local_50,"\'\\0\' }");
  }
  Formatter::operator()<>((Formatter *)local_50,";\n");
  Formatter::Outdent((Formatter *)local_50);
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)local_398);
  GetCrossFileReferencesForFile(this,this->file_,(CrossFileReferences *)local_398);
  sVar10 = std::
           unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::size((unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&refs.weak_default_instances._M_h._M_single_bucket);
  pOVar8 = (Options *)
           std::
           unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::size((unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&refs.strong_reflection_files._M_h._M_single_bucket);
  __range4._4_4_ = (int)sVar10 + (int)pOVar8;
  if (0 < __range4._4_4_) {
    Formatter::operator()
              ((Formatter *)local_50,
               "static const ::$proto_ns$::internal::DescriptorTable*const $desc_table$_deps[$1$] = {\n"
               ,(int *)((long)&__range4 + 4));
    anon_unknown_20::Sorted<google::protobuf::FileDescriptor>
              ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&__begin4,
               (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&refs.weak_default_instances._M_h._M_single_bucket);
    __end4 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *)&__begin4);
    dep = (FileDescriptor *)
          std::
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)&__begin4);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end4,(__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                  *)&dep);
      if (!bVar1) break;
      ppFVar11 = __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                 ::operator*(&__end4);
      local_3d8 = (cpp *)*ppFVar11;
      DescriptorTableName_abi_cxx11_
                ((string *)&__range4_1,local_3d8,(FileDescriptor *)&this->options_,pOVar8);
      Formatter::operator()
                ((Formatter *)local_50,"  &::$1$,\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range4_1);
      std::__cxx11::string::~string((string *)&__range4_1);
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
      ::operator++(&__end4);
    }
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)&__begin4);
    anon_unknown_20::Sorted<google::protobuf::FileDescriptor>
              ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&__begin4_1,
               (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&refs.strong_reflection_files._M_h._M_single_bucket);
    __end4_1 = std::
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)&__begin4_1);
    dep_1 = (FileDescriptor *)
            std::
            vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&__begin4_1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end4_1,
                         (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                          *)&dep_1);
      if (!bVar1) break;
      ppFVar11 = __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                 ::operator*(&__end4_1);
      local_430 = (cpp *)*ppFVar11;
      DescriptorTableName_abi_cxx11_
                ((string *)local_450,local_430,(FileDescriptor *)&this->options_,pOVar8);
      Formatter::operator()
                ((Formatter *)local_50,"  &::$1$,\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
      std::__cxx11::string::~string((string *)local_450);
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
      ::operator++(&__end4_1);
    }
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)&__begin4_1);
    Formatter::operator()<>((Formatter *)local_50,"};\n");
  }
  local_451 = 0;
  local_460 = "false";
  local_468 = std::__cxx11::string::size();
  local_48a = 0;
  local_4b2 = 0;
  local_4b3 = 0;
  if (__range4._4_4_ == 0) {
    std::allocator<char>::allocator();
    local_48a = 1;
    std::__cxx11::string::string((string *)&local_488,"nullptr",&local_489);
  }
  else {
    std::allocator<char>::allocator();
    local_4b2 = 1;
    std::__cxx11::string::string((string *)&local_4b0,"desc_table",&local_4b1);
    local_4b3 = 1;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->variables_,&local_4b0);
    std::operator+(&local_488,pmVar12,"_deps");
  }
  local_4c0 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::size(&this->message_generators_);
  bVar1 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::empty(&this->message_generators_);
  local_4e2 = 0;
  local_50a = 0;
  local_50b = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_4e2 = 1;
    std::__cxx11::string::string((string *)&local_4e0,"nullptr",&local_4e1);
  }
  else {
    std::allocator<char>::allocator();
    local_50a = 1;
    std::__cxx11::string::string((string *)&local_508,"file_level_metadata",&local_509);
    local_50b = 1;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->variables_,&local_508);
    std::__cxx11::string::string((string *)&local_4e0,(string *)pmVar12);
  }
  Formatter::operator()
            ((Formatter *)local_50,
             "static ::$proto_ns$::internal::once_flag $desc_table$_once;\nconst ::$proto_ns$::internal::DescriptorTable $desc_table$ = {\n  false, $1$, $2$, $3$, \"$filename$\", \n  &$desc_table$_once, $4$, $5$, $6$,\n  schemas, file_default_instances, $tablename$::offsets,\n  $7$, $file_level_enum_descriptors$, $file_level_service_descriptors$,\n};\nPROTOBUF_ATTRIBUTE_WEAK const ::$proto_ns$::internal::DescriptorTable* $desc_table$_getter() {\n  return &$desc_table$;\n}\n\n"
             ,&local_460,&local_468,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
             &local_488,(int *)((long)&__range4 + 4),&local_4c0,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  if ((local_50b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_508);
  }
  if ((local_50a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
  }
  if ((local_4e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  }
  std::__cxx11::string::~string((string *)&local_488);
  if ((local_4b3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_4b0);
  }
  if ((local_4b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  }
  if ((local_48a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
  }
  __lhs = FileDescriptor::name_abi_cxx11_(this->file_);
  bVar1 = std::operator!=(__lhs,"net/proto2/proto/descriptor.proto");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_550,"dynamic_init_dummy",&local_551);
    UniqueName(&local_530,&local_550,this->file_,&this->options_);
    Formatter::operator()
              ((Formatter *)local_50,
               "// Force running AddDescriptors() at dynamic initialization time.\nPROTOBUF_ATTRIBUTE_INIT_PRIORITY static ::$proto_ns$::internal::AddDescriptorsRunner $1$(&$desc_table$);\n"
               ,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
  }
  CrossFileReferences::~CrossFileReferences((CrossFileReferences *)local_398);
  std::__cxx11::string::~string((string *)&j);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8));
  std::__cxx11::string::~string((string *)local_120);
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* printer) {
  Formatter format(printer, variables_);

  if (!message_generators_.empty()) {
    format("static ::$proto_ns$::Metadata $file_level_metadata$[$1$];\n",
           message_generators_.size());
  }
  if (!enum_generators_.empty()) {
    format(
        "static "
        "const ::$proto_ns$::EnumDescriptor* "
        "$file_level_enum_descriptors$[$1$];\n",
        enum_generators_.size());
  } else {
    format(
        "static "
        "constexpr ::$proto_ns$::EnumDescriptor const** "
        "$file_level_enum_descriptors$ = nullptr;\n");
  }
  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    format(
        "static "
        "const ::$proto_ns$::ServiceDescriptor* "
        "$file_level_service_descriptors$[$1$];\n",
        file_->service_count());
  } else {
    format(
        "static "
        "constexpr ::$proto_ns$::ServiceDescriptor const** "
        "$file_level_service_descriptors$ = nullptr;\n");
  }

  if (!message_generators_.empty()) {
    format(
        "\n"
        "const $uint32$ $tablename$::offsets[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();
    std::vector<std::pair<size_t, size_t> > pairs;
    pairs.reserve(message_generators_.size());
    for (int i = 0; i < message_generators_.size(); i++) {
      pairs.push_back(message_generators_[i]->GenerateOffsets(printer));
    }
    format.Outdent();
    format(
        "};\n"
        "static const ::$proto_ns$::internal::MigrationSchema schemas[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();
    {
      int offset = 0;
      for (int i = 0; i < message_generators_.size(); i++) {
        message_generators_[i]->GenerateSchema(printer, offset,
                                               pairs[i].second);
        offset += pairs[i].first;
      }
    }
    format.Outdent();
    format(
        "};\n"
        "\nstatic "
        "::$proto_ns$::Message const * const file_default_instances[] = {\n");
    format.Indent();
    for (int i = 0; i < message_generators_.size(); i++) {
      const Descriptor* descriptor = message_generators_[i]->descriptor_;
      format(
          "reinterpret_cast<const "
          "::$proto_ns$::Message*>(&$1$::_$2$_default_instance_),\n",
          Namespace(descriptor, options_),  // 1
          ClassName(descriptor));           // 2
    }
    format.Outdent();
    format(
        "};\n"
        "\n");
  } else {
    // we still need these symbols to exist
    format(
        // MSVC doesn't like empty arrays, so we add a dummy.
        "const $uint32$ $tablename$::offsets[1] = {};\n"
        "static constexpr ::$proto_ns$::internal::MigrationSchema* schemas = "
        "nullptr;"
        "\n"
        "static constexpr ::$proto_ns$::Message* const* "
        "file_default_instances = nullptr;\n"
        "\n");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.
  const std::string protodef_name =
      UniqueName("descriptor_table_protodef", file_, options_);
  format("const char $1$[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) =\n",
         protodef_name);
  format.Indent();
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  {
    if (file_data.size() > 65535) {
      // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
      // 65535 bytes in length". Declare a static array of chars rather than
      // use a string literal. Only write 25 bytes per line.
      static const int kBytesPerLine = 25;
      format("{ ");
      for (int i = 0; i < file_data.size();) {
        for (int j = 0; j < kBytesPerLine && i < file_data.size(); ++i, ++j) {
          format("'$1$', ", CEscape(file_data.substr(i, 1)));
        }
        format("\n");
      }
      format("'\\0' }");  // null-terminate
    } else {
      // Only write 40 bytes per line.
      static const int kBytesPerLine = 40;
      for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
        format(
            "\"$1$\"\n",
            EscapeTrigraphs(CEscape(file_data.substr(i, kBytesPerLine))));
      }
    }
    format(";\n");
  }
  format.Outdent();

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  int num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    format(
        "static const ::$proto_ns$::internal::DescriptorTable*const "
        "$desc_table$_deps[$1$] = {\n",
        num_deps);

    for (auto dep : Sorted(refs.strong_reflection_files)) {
      format("  &::$1$,\n", DescriptorTableName(dep, options_));
    }
    for (auto dep : Sorted(refs.weak_reflection_files)) {
      format("  &::$1$,\n", DescriptorTableName(dep, options_));
    }

    format("};\n");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  format(
      "static ::$proto_ns$::internal::once_flag $desc_table$_once;\n"
      "const ::$proto_ns$::internal::DescriptorTable $desc_table$ = {\n"
      "  false, $1$, $2$, $3$, \"$filename$\", \n"
      "  &$desc_table$_once, $4$, $5$, $6$,\n"
      "  schemas, file_default_instances, $tablename$::offsets,\n"
      "  $7$, $file_level_enum_descriptors$, "
      "$file_level_service_descriptors$,\n"
      "};\n"
      // This function exists to be marked as weak.
      // It can significantly speed up compilation by breaking up LLVM's SCC in
      // the .pb.cc translation units. Large translation units see a reduction
      // of more than 35% of walltime for optimized builds.
      // Without the weak attribute all the messages in the file, including all
      // the vtables and everything they use become part of the same SCC through
      // a cycle like:
      // GetMetadata -> descriptor table -> default instances ->
      //   vtables -> GetMetadata
      // By adding a weak function here we break the connection from the
      // individual vtables back into the descriptor table.
      "PROTOBUF_ATTRIBUTE_WEAK const ::$proto_ns$::internal::DescriptorTable* "
      "$desc_table$_getter() {\n"
      "  return &$desc_table$;\n"
      "}\n"
      "\n",
      eager ? "true" : "false", file_data.size(), protodef_name,
      num_deps == 0 ? "nullptr" : variables_["desc_table"] + "_deps", num_deps,
      message_generators_.size(),
      message_generators_.empty() ? "nullptr"
                                  : variables_["file_level_metadata"]);

  // For descriptor.proto we want to avoid doing any dynamic initialization,
  // because in some situations that would otherwise pull in a lot of
  // unnecessary code that can't be stripped by --gc-sections. Descriptor
  // initialization will still be performed lazily when it's needed.
  if (file_->name() != "net/proto2/proto/descriptor.proto") {
    format(
        "// Force running AddDescriptors() at dynamic initialization time.\n"
        "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
        "static ::$proto_ns$::internal::AddDescriptorsRunner "
        "$1$(&$desc_table$);\n",
        UniqueName("dynamic_init_dummy", file_, options_));
  }
}